

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

void __thiscall ON_String::TrimRight(ON_String *this,char *s)

{
  char cVar1;
  char *pcVar2;
  ON_Internal_Empty_aString *pOVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  pcVar2 = this->m_s;
  pOVar3 = (ON_Internal_Empty_aString *)(pcVar2 + -0xc);
  if (pcVar2 == (char *)0x0) {
    pOVar3 = &empty_astring;
  }
  uVar4 = (ulong)(pOVar3->header).string_length;
  if (0 < (long)uVar4) {
    if (s == (char *)0x0) {
      do {
        uVar6 = uVar4;
        if ((long)uVar6 < 1) goto LAB_005c13ee;
      } while (('\0' < pcVar2[uVar6 - 1]) &&
              (uVar4 = uVar6 - 1, 0x5d < (byte)(pcVar2[uVar6 - 1] - 0x21U)));
    }
    else {
      do {
        uVar6 = uVar4;
        if ((long)uVar6 < 1) {
LAB_005c13ee:
          Destroy(this);
          return;
        }
        pcVar5 = s;
        if (pcVar2[uVar6 - 1] == '\0') break;
        do {
          cVar1 = *pcVar5;
          if (cVar1 == '\0') break;
          pcVar5 = pcVar5 + 1;
        } while (cVar1 != pcVar2[uVar6 - 1]);
        uVar4 = uVar6 - 1;
      } while (cVar1 != '\0');
    }
    if (pcVar2[uVar6 & 0xffffffff] != '\0') {
      CopyArray(this);
      this->m_s[uVar6 & 0xffffffff] = '\0';
      pOVar3 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      if (this->m_s == (char *)0x0) {
        pOVar3 = &empty_astring;
      }
      (pOVar3->header).string_length = (int)uVar6;
    }
  }
  return;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}